

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

Vec_Ptr_t *
Acb_TransformPatchFunctions(Vec_Ptr_t *vSops,Vec_Wec_t *vSupps,Vec_Int_t **pvUsed,int nDivs)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Vec_Int_t *p;
  int *piVar6;
  Vec_Int_t *vMap;
  void *__s;
  size_t sVar7;
  char *__dest;
  char *pcVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  
  iVar14 = vSops->nSize;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  iVar9 = 8;
  if (6 < iVar14 - 1U) {
    iVar9 = iVar14;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar9;
  if (iVar9 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar9 << 3);
  }
  pVVar4->pArray = ppvVar5;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar6 = (int *)malloc(400);
  p->pArray = piVar6;
  vMap = (Vec_Int_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < nDivs - 1U) {
    iVar14 = nDivs;
  }
  vMap->nSize = 0;
  vMap->nCap = iVar14;
  if (iVar14 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar14 * 4);
  }
  vMap->pArray = piVar6;
  vMap->nSize = nDivs;
  if (piVar6 != (int *)0x0) {
    memset(piVar6,0xff,(long)nDivs * 4);
  }
  if (iVar14 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar14 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)nDivs << 2);
  }
  if (vSupps->nSize < 1) {
LAB_00375498:
    if (0 < vSupps->nSize) {
      lVar15 = 0;
      do {
        pVVar3 = vSupps->pArray;
        if (0 < pVVar3[lVar15].nSize) {
          lVar10 = 0;
          do {
            iVar14 = pVVar3[lVar15].pArray[lVar10];
            lVar12 = (long)iVar14;
            if ((lVar12 < 0) || (nDivs <= iVar14)) {
LAB_00375677:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if ((*(int *)((long)__s + lVar12 * 4) != 0) && (piVar6[lVar12] < 0)) {
              piVar6[lVar12] = p->nSize;
              Vec_IntPush(p,iVar14);
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < pVVar3[lVar15].nSize);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < vSupps->nSize);
    }
    if (nDivs < 1) {
      uVar13 = 0;
    }
    else {
      uVar11 = 0;
      uVar13 = 0;
      do {
        uVar13 = (ulong)(uint)((int)uVar13 + *(int *)((long)__s + uVar11 * 4));
        uVar11 = uVar11 + 1;
      } while ((uint)nDivs != uVar11);
    }
    printf("The number of used variables %d (out of %d).\n",uVar13,(ulong)(uint)nDivs);
    if (0 < vSupps->nSize) {
      lVar10 = 0;
      lVar15 = 0;
      do {
        if (vSops->nSize <= lVar15) goto LAB_003756b5;
        pcVar8 = Acb_RemapOneFunction
                           ((char *)vSops->pArray[lVar15],
                            (Vec_Int_t *)((long)&vSupps->pArray->nCap + lVar10),vMap,p->nSize);
        uVar1 = pVVar4->nSize;
        uVar2 = pVVar4->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
            }
            iVar14 = 0x10;
          }
          else {
            iVar14 = uVar2 * 2;
            if (iVar14 <= (int)uVar2) goto LAB_003755f0;
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
            }
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = iVar14;
        }
LAB_003755f0:
        pVVar4->nSize = uVar1 + 1;
        pVVar4->pArray[(int)uVar1] = pcVar8;
        lVar15 = lVar15 + 1;
        lVar10 = lVar10 + 0x10;
      } while (lVar15 < vSupps->nSize);
    }
    if (__s != (void *)0x0) {
      free(__s);
    }
    if (piVar6 != (int *)0x0) {
      free(piVar6);
      vMap->pArray = (int *)0x0;
    }
    free(vMap);
    *pvUsed = p;
    return pVVar4;
  }
  lVar15 = 0;
  while (lVar15 < vSops->nSize) {
    pVVar3 = vSupps->pArray;
    pcVar8 = (char *)vSops->pArray[lVar15];
    if (pcVar8 == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      sVar7 = strlen(pcVar8);
      __dest = (char *)malloc(sVar7 + 1);
      strcpy(__dest,pcVar8);
    }
    pcVar8 = strtok(__dest,"\n");
    if (pcVar8 != (char *)0x0) {
LAB_00375426:
      lVar10 = 0;
      do {
        if (pcVar8[lVar10] != '-') {
          if (pcVar8[lVar10] == ' ') goto LAB_0037546a;
          if (pVVar3[lVar15].nSize <= lVar10) goto LAB_00375677;
          iVar14 = pVVar3[lVar15].pArray[lVar10];
          if (((long)iVar14 < 0) || (nDivs <= iVar14)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(undefined4 *)((long)__s + (long)iVar14 * 4) = 1;
        }
        lVar10 = lVar10 + 1;
      } while( true );
    }
LAB_00375479:
    if (__dest != (char *)0x0) {
      free(__dest);
    }
    lVar15 = lVar15 + 1;
    if (vSupps->nSize <= lVar15) goto LAB_00375498;
  }
LAB_003756b5:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
LAB_0037546a:
  pcVar8 = strtok((char *)0x0,"\n");
  if (pcVar8 == (char *)0x0) goto LAB_00375479;
  goto LAB_00375426;
}

Assistant:

Vec_Ptr_t * Acb_TransformPatchFunctions( Vec_Ptr_t * vSops, Vec_Wec_t * vSupps, Vec_Int_t ** pvUsed, int nDivs )
{
    Vec_Ptr_t * vFuncs = Vec_PtrAlloc( Vec_PtrSize(vSops) );
    Vec_Int_t * vUsed = Vec_IntAlloc( 100 ); 
    Vec_Int_t * vMap = Vec_IntStartFull( nDivs );
    Vec_Int_t * vPres = Vec_IntStart( nDivs );
    Vec_Int_t * vLevel;
    int i, k, iVar;
    // check what divisors are used
    Vec_WecForEachLevel( vSupps, vLevel, i )
    {
        char * pSop = (char *)Vec_PtrEntry( vSops, i );
        char * pStrCopy = Abc_UtilStrsav( pSop );
        char * pToken = strtok( pStrCopy, "\n" ); 
        while ( pToken != NULL )
        {
            for ( k = 0; pToken[k] != ' '; k++ )
                if ( pToken[k] != '-' )
                    Vec_IntWriteEntry( vPres, Vec_IntEntry(vLevel, k), 1 );
            pToken = strtok( NULL, "\n" );
        }
        ABC_FREE( pStrCopy );
    }
    // create common order
    Vec_WecForEachLevel( vSupps, vLevel, i )
        Vec_IntForEachEntry( vLevel, iVar, k )
        {
            if ( !Vec_IntEntry(vPres, iVar) )
                continue;
            if ( Vec_IntEntry(vMap, iVar) >= 0 )
                continue;
            Vec_IntWriteEntry( vMap, iVar, Vec_IntSize(vUsed) );
            Vec_IntPush( vUsed, iVar );
        }
    printf( "The number of used variables %d (out of %d).\n", Vec_IntSum(vPres), Vec_IntSize(vPres) );
    // remap SOPs
    Vec_WecForEachLevel( vSupps, vLevel, i )
    {
        char * pSop = (char *)Vec_PtrEntry( vSops, i );
        pSop = Acb_RemapOneFunction( pSop, vLevel, vMap, Vec_IntSize(vUsed) );
        //printf( "Function %d\n%s", i, pSop );
        Vec_PtrPush( vFuncs, pSop );
    }
    Vec_IntFree( vPres );
    Vec_IntFree( vMap );
    *pvUsed = vUsed;
    return vFuncs;
}